

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O0

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Resample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,vector<despot::State_*,_std::allocator<despot::State_*>_> *belief,DSPOMDP *model,
          History *history,int hstart)

{
  value_type pSVar1;
  History *pHVar2;
  bool bVar3;
  ACT_TYPE AVar4;
  int iVar5;
  const_reference ppSVar6;
  size_type sVar7;
  ulong uVar8;
  size_t sVar9;
  OBS_TYPE OVar10;
  double *pdVar11;
  size_type sVar12;
  reference ppSVar13;
  log_ostream *plVar14;
  ostream *poVar15;
  double dVar16;
  double dVar17;
  int local_ec;
  int local_e8;
  int i_4;
  int i_3;
  int i_2;
  double total_weight;
  __normal_iterator<despot::State_**,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>
  local_d0;
  __normal_iterator<despot::State_**,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>
  local_c8;
  const_iterator local_c0;
  int local_b4;
  double dStack_b0;
  int i_1;
  double prob;
  double dStack_a0;
  int i;
  double log_wgt;
  value_type local_88;
  State *particle;
  double dStack_78;
  int trial;
  double max_wgt;
  int count;
  OBS_TYPE obs;
  double reward;
  double cur;
  double dStack_48;
  int pos;
  double mass;
  double unit;
  History *pHStack_30;
  int hstart_local;
  History *history_local;
  DSPOMDP *model_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *belief_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *pvStack_10;
  int num_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *sample;
  
  mass = 1.0 / (double)num;
  unit._4_4_ = hstart;
  pHStack_30 = history;
  history_local = (History *)model;
  model_local = (DSPOMDP *)belief;
  belief_local._4_4_ = num;
  pvStack_10 = __return_storage_ptr__;
  dStack_48 = Random::NextDouble((Random *)&Random::RANDOM,0.0,mass);
  cur._4_4_ = 0;
  ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                      ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)model_local,0);
  reward = (*ppSVar6)->weight;
  max_wgt._7_1_ = 0;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(__return_storage_ptr__);
  max_wgt._0_4_ = 0;
  dStack_78 = -INFINITY;
  particle._4_4_ = 0;
  do {
    bVar3 = false;
    if (max_wgt._0_4_ < belief_local._4_4_) {
      bVar3 = SBORROW4(particle._4_4_,belief_local._4_4_ * 200) !=
              particle._4_4_ + belief_local._4_4_ * -200 < 0;
    }
    if (!bVar3) {
      _i_3 = 0.0;
      for (i_4 = 0; sVar12 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                                       (__return_storage_ptr__), (ulong)(long)i_4 < sVar12;
          i_4 = i_4 + 1) {
        ppSVar13 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)i_4);
        dVar17 = exp((*ppSVar13)->weight - dStack_78);
        ppSVar13 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)i_4);
        (*ppSVar13)->weight = dVar17;
        ppSVar13 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)i_4);
        _i_3 = (*ppSVar13)->weight + _i_3;
      }
      for (local_e8 = 0;
          sVar12 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                             (__return_storage_ptr__), (ulong)(long)local_e8 < sVar12;
          local_e8 = local_e8 + 1) {
        ppSVar13 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)local_e8);
        dVar17 = (*ppSVar13)->weight;
        ppSVar13 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)local_e8);
        (*ppSVar13)->weight = dVar17 / _i_3;
      }
      iVar5 = logging::level();
      if ((0 < iVar5) && (iVar5 = logging::level(), 3 < iVar5)) {
        plVar14 = logging::stream(4);
        poVar15 = std::operator<<(&plVar14->super_ostream,"[Belief::Resample] Resampled ");
        sVar12 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                           (__return_storage_ptr__);
        poVar15 = (ostream *)std::ostream::operator<<(poVar15,sVar12);
        poVar15 = std::operator<<(poVar15," particles");
        std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
      }
      for (local_ec = 0;
          sVar12 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                             (__return_storage_ptr__), (ulong)(long)local_ec < sVar12;
          local_ec = local_ec + 1) {
        iVar5 = logging::level();
        if ((0 < iVar5) && (iVar5 = logging::level(), 4 < iVar5)) {
          plVar14 = logging::stream(5);
          poVar15 = std::operator<<(&plVar14->super_ostream," ");
          poVar15 = (ostream *)std::ostream::operator<<(poVar15,local_ec);
          poVar15 = std::operator<<(poVar15," = ");
          ppSVar13 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                               (__return_storage_ptr__,(long)local_ec);
          poVar15 = despot::operator<<(poVar15,*ppSVar13);
          std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
        }
      }
      return __return_storage_ptr__;
    }
    for (; pHVar2 = history_local, reward < dStack_48; reward = (*ppSVar6)->weight + reward) {
      cur._4_4_ = cur._4_4_ + 1;
      sVar12 = (size_type)cur._4_4_;
      sVar7 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)model_local);
      if (sVar12 == sVar7) {
        cur._4_4_ = 0;
      }
      ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                          ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)model_local,
                           (long)cur._4_4_);
    }
    particle._4_4_ = particle._4_4_ + 1;
    dStack_48 = dStack_48 + mass;
    ppSVar6 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)model_local,
                         (long)cur._4_4_);
    local_88 = (value_type)
               (**(code **)((pHVar2->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start + 0x2c))(pHVar2,*ppSVar6);
    dStack_a0 = 0.0;
    for (prob._4_4_ = unit._4_4_; uVar8 = (ulong)prob._4_4_, sVar9 = History::Size(history),
        pHVar2 = history_local, pSVar1 = local_88, uVar8 < sVar9; prob._4_4_ = prob._4_4_ + 1) {
      dVar17 = Random::NextDouble((Random *)&Random::RANDOM);
      AVar4 = History::Action(history,prob._4_4_);
      (**(code **)((pHVar2->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + 4))(dVar17,pHVar2,pSVar1,AVar4,&obs,&count);
      pHVar2 = history_local;
      OVar10 = History::Observation(history,prob._4_4_);
      pSVar1 = local_88;
      AVar4 = History::Action(history,prob._4_4_);
      dStack_b0 = (double)(**(code **)((pHVar2->actions_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + 0xe))
                                    (pHVar2,OVar10,pSVar1,AVar4);
      if (dStack_b0 <= 0.0) {
        (**(code **)((history_local->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                     .super__Vector_impl_data._M_start + 0x2e))(history_local,local_88);
        break;
      }
      dVar17 = log(dStack_b0);
      dStack_a0 = dVar17 + dStack_a0;
    }
    bVar3 = MemoryObject::IsAllocated(&local_88->super_MemoryObject);
    if (bVar3) {
      max_wgt._0_4_ = max_wgt._0_4_ + 1;
      local_88->weight = dStack_a0;
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
                (__return_storage_ptr__,&local_88);
      pdVar11 = std::max<double>(&stack0xffffffffffffff60,&stack0xffffffffffffff88);
      dStack_78 = *pdVar11;
    }
    if (max_wgt._0_4_ == belief_local._4_4_) {
      sVar12 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size
                         (__return_storage_ptr__);
      local_b4 = (int)sVar12;
      while (local_b4 = local_b4 + -1, -1 < local_b4) {
        ppSVar13 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                             (__return_storage_ptr__,(long)local_b4);
        dVar17 = (*ppSVar13)->weight - dStack_78;
        dVar16 = log(1.0 / (double)belief_local._4_4_);
        pHVar2 = history_local;
        if (dVar17 < dVar16) {
          ppSVar13 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                               (__return_storage_ptr__,(long)local_b4);
          (**(code **)((pHVar2->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + 0x2e))(pHVar2,*ppSVar13);
          local_d0._M_current =
               (State **)
               std::vector<despot::State_*,_std::allocator<despot::State_*>_>::begin
                         (__return_storage_ptr__);
          local_c8 = __gnu_cxx::
                     __normal_iterator<despot::State_**,_std::vector<despot::State_*,_std::allocator<despot::State_*>_>_>
                     ::operator+(&local_d0,(long)local_b4);
          __gnu_cxx::
          __normal_iterator<despot::State*const*,std::vector<despot::State*,std::allocator<despot::State*>>>
          ::__normal_iterator<despot::State**>
                    ((__normal_iterator<despot::State*const*,std::vector<despot::State*,std::allocator<despot::State*>>>
                      *)&local_c0,&local_c8);
          std::vector<despot::State_*,_std::allocator<despot::State_*>_>::erase
                    (__return_storage_ptr__,local_c0);
          max_wgt._0_4_ = max_wgt._0_4_ + -1;
        }
      }
    }
  } while( true );
}

Assistant:

vector<State*> ParticleBelief::Resample(int num, const vector<State*>& belief,
	const DSPOMDP* model, History history, int hstart) {
	double unit = 1.0 / num;
	double mass = Random::RANDOM.NextDouble(0, unit);
	int pos = 0;
	double cur = belief[0]->weight;

	double reward;
	OBS_TYPE obs;

	vector<State*> sample;
	int count = 0;
	double max_wgt = Globals::NEG_INFTY;
	int trial = 0;
	while (count < num && trial < 200 * num) {
		// Pick next particle
		while (mass > cur) {
			pos++;
			if (pos == belief.size())
				pos = 0;

			cur += belief[pos]->weight;
		}
		trial++;

		mass += unit;

		State* particle = model->Copy(belief[pos]);

		// Step through history
		double log_wgt = 0;
		for (int i = hstart; i < history.Size(); i++) {
			model->Step(*particle, Random::RANDOM.NextDouble(),
				history.Action(i), reward, obs);

			double prob = model->ObsProb(history.Observation(i), *particle,
				history.Action(i));
			if (prob > 0) {
				log_wgt += log(prob);
			} else {
				model->Free(particle);
				break;
			}
		}

		// Add to sample if survived
		if (particle->IsAllocated()) {
			count++;

			particle->weight = log_wgt;
			sample.push_back(particle);

			max_wgt = max(log_wgt, max_wgt);
		}

		// Remove particles with very small weights
		if (count == num) {
			for (int i = sample.size() - 1; i >= 0; i--)
				if (sample[i]->weight - max_wgt < log(1.0 / num)) {
					model->Free(sample[i]);
					sample.erase(sample.begin() + i);
					count--;
				}
		}
	}

	double total_weight = 0;
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = exp(sample[i]->weight - max_wgt);
		total_weight += sample[i]->weight;
	}
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = sample[i]->weight / total_weight;
	}

	logd << "[Belief::Resample] Resampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}